

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

SC_Lib * Abc_SclReadLiberty(char *pFileName,int fVerbose,int fVeryVerbose)

{
  Scl_Tree_t *p;
  Vec_Str_t *vOut;
  SC_Lib *p_00;
  char *pcVar1;
  
  p = Scl_LibertyParse(pFileName,fVeryVerbose);
  if (p != (Scl_Tree_t *)0x0) {
    vOut = Scl_LibertyReadSclStr(p,fVerbose,fVeryVerbose);
    Scl_LibertyStop(p,fVeryVerbose);
    if ((vOut != (Vec_Str_t *)0x0) && (p_00 = Abc_SclReadFromStr(vOut), p_00 != (SC_Lib *)0x0)) {
      pcVar1 = Abc_UtilStrsav(pFileName);
      p_00->pFileName = pcVar1;
      Abc_SclLibNormalize(p_00);
      Vec_StrFree(vOut);
      return p_00;
    }
  }
  return (SC_Lib *)0x0;
}

Assistant:

SC_Lib * Abc_SclReadLiberty( char * pFileName, int fVerbose, int fVeryVerbose )
{
    SC_Lib * pLib;
    Scl_Tree_t * p;
    Vec_Str_t * vStr;
    p = Scl_LibertyParse( pFileName, fVeryVerbose );
    if ( p == NULL )
        return NULL;
//    Scl_LibertyParseDump( p, "temp_.lib" );
    // collect relevant data
    vStr = Scl_LibertyReadSclStr( p, fVerbose, fVeryVerbose );
    Scl_LibertyStop( p, fVeryVerbose );
    if ( vStr == NULL )
        return NULL;
    // construct SCL data-structure
    pLib = Abc_SclReadFromStr( vStr );
    if ( pLib == NULL )
        return NULL;
    pLib->pFileName = Abc_UtilStrsav( pFileName );
    Abc_SclLibNormalize( pLib );
    Vec_StrFree( vStr );
//    printf( "Average slew = %.2f ps\n", Abc_SclComputeAverageSlew(pLib) );
    return pLib;
}